

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib-flate.cc
# Opt level: O3

void usage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,whoami);
  poVar1 = std::operator<<(poVar1," { -uncompress | -compress[=n] }");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "If n is specified with -compress, it is a zlib compression level from");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "1 to 9 where lower numbers are faster and less compressed and higher");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"numbers are slower and more compressed");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(2);
}

Assistant:

void
usage()
{
    std::cerr << "Usage: " << whoami << " { -uncompress | -compress[=n] }" << std::endl
              << "If n is specified with -compress, it is a zlib compression level from"
              << std::endl
              << "1 to 9 where lower numbers are faster and less compressed and higher" << std::endl
              << "numbers are slower and more compressed" << std::endl;
    exit(2);
}